

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_circle.cpp
# Opt level: O2

double __thiscall ON_Circle::EquationAt(ON_Circle *this,ON_2dPoint *p)

{
  double dVar1;
  double dVar2;
  
  dVar2 = this->radius;
  dVar1 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar1 = p->x / dVar2;
    dVar2 = p->y / dVar2;
    dVar1 = dVar1 * dVar1 + dVar2 * dVar2 + -1.0;
  }
  return dVar1;
}

Assistant:

double ON_Circle::EquationAt( 
                 const ON_2dPoint& p // coordinates in plane
                 ) const
{
  double e, x, y;
  if ( radius != 0.0 ) {
    x = p.x/radius;
    y = p.y/radius;
    e = x*x + y*y - 1.0;
  }
  else {
    e = 0.0;
  }
  return e;
}